

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void build_btree_sampler<double>
               (vector<double,_std::allocator<double>_> *btree_weights,double *sample_weights,
               size_t nrows,size_t *log2_n,size_t *btree_offset)

{
  pointer pdVar1;
  pointer pdVar2;
  double *pdVar3;
  size_t sVar4;
  ulong uVar5;
  double dVar6;
  value_type_conflict local_38;
  
  sVar4 = log2ceil(nrows);
  *log2_n = sVar4;
  pdVar1 = (btree_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (btree_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 == pdVar2) {
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize
              (btree_weights,1L << ((byte)sVar4 + 1 & 0x3f),&local_38);
  }
  else {
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (btree_weights,(long)pdVar2 - (long)pdVar1 >> 3,&local_38);
  }
  uVar5 = ~(-1L << ((byte)sVar4 & 0x3f));
  *btree_offset = uVar5;
  pdVar1 = (btree_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar4 = 0; nrows != sVar4; sVar4 = sVar4 + 1) {
    dVar6 = sample_weights[sVar4];
    if (dVar6 <= 0.0) {
      dVar6 = 0.0;
    }
    pdVar1[uVar5 + sVar4] = dVar6;
  }
  pdVar3 = (btree_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar5 = ((long)(btree_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar3 >> 3) - 2;
      uVar5 != 0xffffffffffffffff; uVar5 = uVar5 - 1) {
    *(double *)((long)pdVar3 + (uVar5 & 0xfffffffffffffffe) * 4) =
         pdVar3[uVar5 + 1] + *(double *)((long)pdVar3 + (uVar5 & 0xfffffffffffffffe) * 4);
  }
  if (*pdVar3 <= 0.0) {
    fputs("Numeric precision error with sample weights, will not use them.\n",_stderr);
    *log2_n = 0;
    pdVar1 = (btree_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((btree_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish != pdVar1) {
      (btree_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = pdVar1;
    }
    std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(btree_weights);
  }
  return;
}

Assistant:

void build_btree_sampler(std::vector<double> &btree_weights, real_t *restrict sample_weights,
                         size_t nrows, size_t &restrict log2_n, size_t &restrict btree_offset)
{
    /* build a perfectly-balanced binary search tree in which each node will
       hold the sum of the weights of its children */
    log2_n = log2ceil(nrows);
    if (btree_weights.empty())
        btree_weights.resize(pow2(log2_n + 1), 0);
    else
        btree_weights.assign(btree_weights.size(), 0);
    btree_offset = pow2(log2_n) - 1;

    for (size_t ix = 0; ix < nrows; ix++)
        btree_weights[ix + btree_offset] = std::fmax(0., sample_weights[ix]);
    for (size_t ix = btree_weights.size() - 1; ix > 0; ix--)
        btree_weights[ix_parent(ix)] += btree_weights[ix];
    
    if (std::isnan(btree_weights[0]) || btree_weights[0] <= 0)
    {
        print_errmsg("Numeric precision error with sample weights, will not use them.\n");
        log2_n = 0;
        btree_weights.clear();
        btree_weights.shrink_to_fit();
    }
}